

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::FederateState::getCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FederateState *this)

{
  CommonCore *pCVar1;
  int iVar2;
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  undefined4 local_e0;
  undefined4 uStack_d8;
  _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined7 local_87;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  _Storage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_78;
  char local_38;
  
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::try_pop((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0,&this->commandQueue);
  if (local_d0._M_engaged == true) {
    do {
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0
                      ,"notify");
      if (iVar2 != 0) break;
      pCVar1 = this->mParent;
      if (pCVar1 != (CommonCore *)0x0) {
        local_e0 = (undefined4)(this->name)._M_string_length;
        uStack_d8 = SUB84((this->name)._M_dataplus._M_p,0);
        (*(pCVar1->super_Core)._vptr_Core[0x5b])
                  (pCVar1,local_d0._M_payload._M_value.second._M_string_length,
                   local_d0._M_payload._M_value.second._M_dataplus._M_p,0xf,"notify_response",0,
                   local_e0,uStack_d8);
      }
      gmlc::containers::
      BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
      ::try_pop((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78._M_value,&this->commandQueue);
      std::
      _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_d0,
                       (_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_78._M_value);
      if (local_38 == '\x01') {
        std::
        _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_destroy((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78._M_value);
      }
    } while (local_d0._M_engaged != false);
  }
  if ((local_d0._M_engaged & 1U) == 0) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
         CONCAT17(local_78._7_1_,local_78._0_7_);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
         CONCAT71(local_78._M_value.first._M_string_length._0_7_,local_78._7_1_);
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 1) = CONCAT17(uStack_80,local_87);
    *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) = CONCAT71(uStack_7f,uStack_80);
    (__return_storage_ptr__->second)._M_string_length = 0;
  }
  else {
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)__return_storage_ptr__,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_d0);
  }
  if ((local_d0._M_engaged & 1U) != 0) {
    std::
    _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_destroy(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> FederateState::getCommand()
{
    auto val = commandQueue.try_pop();
    while (val && val->first == "notify") {
        if (mParent != nullptr) {
            mParent->sendCommand(val->second,
                                 "notify_response",
                                 name,
                                 HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        }
        val = commandQueue.try_pop();
    }
    return (val) ? *val : std::pair<std::string, std::string>{std::string{}, std::string{}};
}